

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Dropout_x86_avx2::forward_inplace(Dropout_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [12];
  float *pfVar16;
  undefined1 (*pauVar17) [12];
  Mat *in_RSI;
  long *in_RDI;
  __m128 _p_5;
  int i_5;
  float *ptr_5;
  int q_1;
  __m128 _p_4;
  int j_1;
  float *ptr_4;
  int i_4;
  __m128 _p_3;
  float *ptr_3;
  int i_3;
  __m128 _scale_1;
  int size_1;
  int channels_1;
  int h_1;
  int w_1;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q;
  __m256 _p_1;
  int j;
  float *ptr_1;
  int i_1;
  __m256 _p;
  float *ptr;
  int i;
  __m256 _scale;
  int size;
  int channels;
  int h;
  int w;
  int elempack;
  int dims;
  undefined1 (*in_stack_fffffffffffffa88) [32];
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  uint uVar18;
  float fStack_554;
  int local_54c;
  Option *in_stack_fffffffffffffaf0;
  Mat *in_stack_fffffffffffffaf8;
  Dropout *in_stack_fffffffffffffb00;
  undefined1 (*pauVar19) [12];
  int local_4f4;
  float fStack_4e4;
  int local_4d4;
  undefined1 (*local_4d0) [12];
  int local_4c4;
  float fStack_4b4;
  int local_4a4;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  int local_448;
  Mat local_438;
  undefined1 (*local_3f0) [32];
  int local_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  int local_3b4;
  undefined1 (*local_3b0) [32];
  int local_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 (*local_370) [32];
  int local_364;
  undefined1 local_360 [32];
  int local_330;
  int local_32c;
  int local_328;
  int local_324;
  int local_320;
  int local_31c;
  Mat *local_310;
  int local_300;
  uint local_2fc;
  undefined1 (*local_2f8) [32];
  undefined1 (*local_2f0) [32];
  undefined1 (*local_2e8) [32];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 (*local_1e8) [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 (*local_1a8) [32];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 (*local_178) [32];
  float local_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float local_15c;
  undefined1 (*local_158) [12];
  undefined1 (*local_150) [12];
  undefined1 (*local_148) [12];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined1 local_130 [8];
  float fStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined1 local_110 [8];
  float fStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined1 local_f0 [8];
  float fStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined1 (*local_c8) [12];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined1 (*local_a8) [12];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 (*local_88) [12];
  undefined1 local_80 [32];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  if ((fVar1 != 1.0) || (NAN(fVar1))) {
    local_31c = in_RSI->dims;
    local_320 = in_RSI->elempack;
    local_310 = in_RSI;
    if (local_320 == 8) {
      local_324 = in_RSI->w;
      local_328 = in_RSI->h;
      local_32c = in_RSI->c;
      local_330 = local_324 * local_328;
      uVar18 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      auVar5 = vinsertps_avx(ZEXT416(uVar18),ZEXT416(uVar18),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar18),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar18),0x30);
      auVar6 = vinsertps_avx(ZEXT416(uVar18),ZEXT416(uVar18),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar18),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar18),0x30);
      local_360._16_16_ = auVar5;
      local_360._0_16_ = auVar6;
      local_320 = 8;
      local_2fc = uVar18;
      local_80 = local_360;
      local_50 = uVar18;
      local_4c = uVar18;
      local_48 = uVar18;
      local_44 = uVar18;
      local_40 = uVar18;
      local_3c = uVar18;
      local_38 = uVar18;
      local_34 = uVar18;
      if (local_31c == 1) {
        for (local_364 = 0; local_364 < local_324; local_364 = local_364 + 1) {
          pfVar16 = ncnn::Mat::operator_cast_to_float_(local_310);
          local_370 = (undefined1 (*) [32])(pfVar16 + (local_364 << 3));
          uVar7 = *(undefined8 *)*local_370;
          uVar8 = *(undefined8 *)(*local_370 + 8);
          uVar9 = *(undefined8 *)(*local_370 + 0x10);
          uVar10 = *(undefined8 *)(*local_370 + 0x18);
          local_240._0_4_ = (float)uVar7;
          local_240._4_4_ = (float)((ulong)uVar7 >> 0x20);
          uStack_238._0_4_ = (float)uVar8;
          uStack_238._4_4_ = (float)((ulong)uVar8 >> 0x20);
          uStack_230._0_4_ = (float)uVar9;
          uStack_230._4_4_ = (float)((ulong)uVar9 >> 0x20);
          uStack_228._0_4_ = (float)uVar10;
          uStack_228._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
          local_260._0_4_ = local_360._0_4_;
          local_260._4_4_ = local_360._4_4_;
          uStack_258._0_4_ = local_360._8_4_;
          uStack_258._4_4_ = local_360._12_4_;
          uStack_250._0_4_ = local_360._16_4_;
          uStack_250._4_4_ = local_360._20_4_;
          uStack_248._0_4_ = local_360._24_4_;
          local_3a0 = CONCAT44(local_240._4_4_ * local_260._4_4_,(float)local_240 * (float)local_260
                              );
          uStack_398 = CONCAT44(uStack_238._4_4_ * uStack_258._4_4_,
                                (float)uStack_238 * (float)uStack_258);
          uStack_390 = CONCAT44(uStack_230._4_4_ * uStack_250._4_4_,
                                (float)uStack_230 * (float)uStack_250);
          uStack_388 = CONCAT44(uStack_228._4_4_,(float)uStack_228 * (float)uStack_248);
          local_1a0 = local_3a0;
          uStack_198 = uStack_398;
          uStack_190 = uStack_390;
          uStack_188 = uStack_388;
          auVar14._8_8_ = uStack_398;
          auVar14._0_8_ = local_3a0;
          auVar14._16_8_ = uStack_390;
          auVar14._24_8_ = uStack_388;
          *local_370 = auVar14;
          local_2e8 = local_370;
          local_260 = local_360._0_8_;
          uStack_258 = local_360._8_8_;
          uStack_250 = local_360._16_8_;
          uStack_248 = local_360._24_8_;
          local_240 = uVar7;
          uStack_238 = uVar8;
          uStack_230 = uVar9;
          uStack_228 = uVar10;
          local_178 = local_370;
        }
      }
      if (local_31c == 2) {
        for (local_3a4 = 0; local_3a4 < local_328; local_3a4 = local_3a4 + 1) {
          local_3b0 = (undefined1 (*) [32])ncnn::Mat::row(local_310,local_3a4);
          for (local_3b4 = 0; local_3b4 < local_324; local_3b4 = local_3b4 + 1) {
            local_2f0 = local_3b0;
            uVar7 = *(undefined8 *)*local_3b0;
            uVar8 = *(undefined8 *)(*local_3b0 + 8);
            uVar9 = *(undefined8 *)(*local_3b0 + 0x10);
            uVar10 = *(undefined8 *)(*local_3b0 + 0x18);
            local_280._0_4_ = (float)uVar7;
            local_280._4_4_ = (float)((ulong)uVar7 >> 0x20);
            uStack_278._0_4_ = (float)uVar8;
            uStack_278._4_4_ = (float)((ulong)uVar8 >> 0x20);
            uStack_270._0_4_ = (float)uVar9;
            uStack_270._4_4_ = (float)((ulong)uVar9 >> 0x20);
            uStack_268._0_4_ = (float)uVar10;
            uStack_268._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
            local_2a0._0_4_ = local_360._0_4_;
            local_2a0._4_4_ = local_360._4_4_;
            uStack_298._0_4_ = local_360._8_4_;
            uStack_298._4_4_ = local_360._12_4_;
            uStack_290._0_4_ = local_360._16_4_;
            uStack_290._4_4_ = local_360._20_4_;
            uStack_288._0_4_ = local_360._24_4_;
            local_3e0 = CONCAT44(local_280._4_4_ * local_2a0._4_4_,
                                 (float)local_280 * (float)local_2a0);
            uStack_3d8 = CONCAT44(uStack_278._4_4_ * uStack_298._4_4_,
                                  (float)uStack_278 * (float)uStack_298);
            uStack_3d0 = CONCAT44(uStack_270._4_4_ * uStack_290._4_4_,
                                  (float)uStack_270 * (float)uStack_290);
            uStack_3c8 = CONCAT44(uStack_268._4_4_,(float)uStack_268 * (float)uStack_288);
            local_1a8 = local_3b0;
            local_1e0 = local_3e0;
            uStack_1d8 = uStack_3d8;
            uStack_1d0 = uStack_3d0;
            uStack_1c8 = uStack_3c8;
            auVar13._8_8_ = uStack_3d8;
            auVar13._0_8_ = local_3e0;
            auVar13._16_8_ = uStack_3d0;
            auVar13._24_8_ = uStack_3c8;
            *local_3b0 = auVar13;
            local_3b0 = local_3b0 + 1;
            local_2a0 = local_360._0_8_;
            uStack_298 = local_360._8_8_;
            uStack_290 = local_360._16_8_;
            uStack_288 = local_360._24_8_;
            local_280 = uVar7;
            uStack_278 = uVar8;
            uStack_270 = uVar9;
            uStack_268 = uVar10;
          }
        }
      }
      if (local_31c == 3) {
        for (local_3e4 = 0; local_3e4 < local_32c; local_3e4 = local_3e4 + 1) {
          ncnn::Mat::channel((Mat *)CONCAT44(uVar18,in_stack_fffffffffffffa90),
                             (int)((ulong)in_stack_fffffffffffffa88 >> 0x20));
          in_stack_fffffffffffffa88 =
               (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_438);
          ncnn::Mat::~Mat((Mat *)0x3803bf);
          local_3f0 = in_stack_fffffffffffffa88;
          for (local_448 = 0; local_448 < local_330; local_448 = local_448 + 1) {
            local_2f8 = local_3f0;
            uVar7 = *(undefined8 *)*local_3f0;
            uVar8 = *(undefined8 *)(*local_3f0 + 8);
            uVar9 = *(undefined8 *)(*local_3f0 + 0x10);
            uVar10 = *(undefined8 *)(*local_3f0 + 0x18);
            local_2c0._0_4_ = (float)uVar7;
            local_2c0._4_4_ = (float)((ulong)uVar7 >> 0x20);
            uStack_2b8._0_4_ = (float)uVar8;
            uStack_2b8._4_4_ = (float)((ulong)uVar8 >> 0x20);
            uStack_2b0._0_4_ = (float)uVar9;
            uStack_2b0._4_4_ = (float)((ulong)uVar9 >> 0x20);
            uStack_2a8._0_4_ = (float)uVar10;
            uStack_2a8._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
            local_2e0._0_4_ = local_360._0_4_;
            local_2e0._4_4_ = local_360._4_4_;
            uStack_2d8._0_4_ = local_360._8_4_;
            uStack_2d8._4_4_ = local_360._12_4_;
            uStack_2d0._0_4_ = local_360._16_4_;
            uStack_2d0._4_4_ = local_360._20_4_;
            uStack_2c8._0_4_ = local_360._24_4_;
            local_480 = CONCAT44(local_2c0._4_4_ * local_2e0._4_4_,
                                 (float)local_2c0 * (float)local_2e0);
            uStack_478 = CONCAT44(uStack_2b8._4_4_ * uStack_2d8._4_4_,
                                  (float)uStack_2b8 * (float)uStack_2d8);
            uStack_470 = CONCAT44(uStack_2b0._4_4_ * uStack_2d0._4_4_,
                                  (float)uStack_2b0 * (float)uStack_2d0);
            uStack_468 = CONCAT44(uStack_2a8._4_4_,(float)uStack_2a8 * (float)uStack_2c8);
            local_1e8 = local_3f0;
            local_220 = local_480;
            uStack_218 = uStack_478;
            uStack_210 = uStack_470;
            uStack_208 = uStack_468;
            auVar12._8_8_ = uStack_478;
            auVar12._0_8_ = local_480;
            auVar12._16_8_ = uStack_470;
            auVar12._24_8_ = uStack_468;
            *local_3f0 = auVar12;
            local_3f0 = local_3f0 + 1;
            local_2e0 = local_360._0_8_;
            uStack_2d8 = local_360._8_8_;
            uStack_2d0 = local_360._16_8_;
            uStack_2c8 = local_360._24_8_;
            local_2c0 = uVar7;
            uStack_2b8 = uVar8;
            uStack_2b0 = uVar9;
            uStack_2a8 = uVar10;
          }
        }
      }
      local_300 = 0;
    }
    else if (local_320 == 4) {
      iVar2 = in_RSI->w;
      iVar3 = in_RSI->h;
      iVar4 = in_RSI->c;
      fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      uVar7 = CONCAT44(fVar1,fVar1);
      uVar8 = CONCAT44(fVar1,fVar1);
      local_320 = 4;
      local_170 = fVar1;
      fStack_16c = fVar1;
      fStack_168 = fVar1;
      fStack_164 = fVar1;
      local_15c = fVar1;
      if (local_31c == 1) {
        for (local_4a4 = 0; local_4a4 < iVar2; local_4a4 = local_4a4 + 1) {
          pfVar16 = ncnn::Mat::operator_cast_to_float_(local_310);
          local_148 = (undefined1 (*) [12])(pfVar16 + (local_4a4 << 2));
          auVar15 = *local_148;
          fStack_4b4 = (float)((ulong)*(undefined8 *)(*local_148 + 8) >> 0x20);
          auVar5._12_4_ = fStack_4b4;
          auVar5._0_12_ = auVar15;
          local_f0._0_4_ = auVar15._0_4_;
          local_f0._4_4_ = auVar15._4_4_;
          fStack_e8 = auVar15._8_4_;
          local_a0 = CONCAT44((float)local_f0._4_4_ * fVar1,(float)local_f0._0_4_ * fVar1);
          uStack_98 = CONCAT44(fStack_4b4 * fVar1,fStack_e8 * fVar1);
          *(undefined8 *)*local_148 = local_a0;
          *(undefined8 *)(*local_148 + 8) = uStack_98;
          local_100 = uVar7;
          uStack_f8 = uVar8;
          _local_f0 = auVar5;
          local_88 = local_148;
        }
      }
      if (local_31c == 2) {
        for (local_4c4 = 0; local_4c4 < iVar3; local_4c4 = local_4c4 + 1) {
          local_4d0 = (undefined1 (*) [12])ncnn::Mat::row(local_310,local_4c4);
          for (local_4d4 = 0; local_4d4 < iVar2; local_4d4 = local_4d4 + 1) {
            local_150 = local_4d0;
            auVar15 = *local_4d0;
            fStack_4e4 = (float)((ulong)*(undefined8 *)(*local_4d0 + 8) >> 0x20);
            auVar6._12_4_ = fStack_4e4;
            auVar6._0_12_ = auVar15;
            local_110._0_4_ = auVar15._0_4_;
            local_110._4_4_ = auVar15._4_4_;
            fStack_108 = auVar15._8_4_;
            local_a8 = local_4d0;
            local_c0 = CONCAT44((float)local_110._4_4_ * fVar1,(float)local_110._0_4_ * fVar1);
            uStack_b8 = CONCAT44(fStack_4e4 * fVar1,fStack_108 * fVar1);
            *(undefined8 *)*local_4d0 = local_c0;
            *(undefined8 *)(*local_4d0 + 8) = uStack_b8;
            local_4d0 = (undefined1 (*) [12])(local_4d0[1] + 4);
            local_120 = uVar7;
            uStack_118 = uVar8;
            _local_110 = auVar6;
          }
        }
      }
      if (local_31c == 3) {
        for (local_4f4 = 0; local_4f4 < iVar4; local_4f4 = local_4f4 + 1) {
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                             (int)((ulong)in_stack_fffffffffffffa88 >> 0x20));
          pauVar17 = (undefined1 (*) [12])
                     ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffffab8);
          ncnn::Mat::~Mat((Mat *)0x380855);
          for (local_54c = 0; pauVar19 = pauVar17, local_54c < iVar2 * iVar3;
              local_54c = local_54c + 1) {
            auVar15 = *pauVar19;
            fStack_554 = (float)((ulong)*(undefined8 *)(*pauVar19 + 8) >> 0x20);
            auVar11._12_4_ = fStack_554;
            auVar11._0_12_ = auVar15;
            local_130._0_4_ = auVar15._0_4_;
            local_130._4_4_ = auVar15._4_4_;
            fStack_128 = auVar15._8_4_;
            local_e0 = CONCAT44((float)local_130._4_4_ * fVar1,(float)local_130._0_4_ * fVar1);
            uStack_d8 = CONCAT44(fStack_554 * fVar1,fStack_128 * fVar1);
            *(undefined8 *)*pauVar19 = local_e0;
            *(undefined8 *)(*pauVar19 + 8) = uStack_d8;
            pauVar17 = (undefined1 (*) [12])(pauVar19[1] + 4);
            local_158 = pauVar19;
            local_140 = uVar7;
            uStack_138 = uVar8;
            _local_130 = auVar11;
            local_c8 = pauVar19;
          }
        }
      }
      local_300 = 0;
    }
    else {
      local_300 = Dropout::forward_inplace
                            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                             in_stack_fffffffffffffaf0);
    }
  }
  else {
    local_300 = 0;
  }
  return local_300;
}

Assistant:

int Dropout_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}